

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCore.c
# Opt level: O0

void Dch_ManSetDefaultParams(Dch_Pars_t *p)

{
  Dch_Pars_t *p_local;
  
  memset(p,0,0x40);
  p->nWords = 8;
  p->nBTLimit = 1000;
  p->nSatVarMax = 5000;
  p->fSynthesis = 1;
  p->fPolarFlip = 1;
  p->fSimulateTfo = 1;
  p->fPower = 0;
  p->fLightSynth = 0;
  p->fSkipRedSupp = 0;
  p->fVerbose = 0;
  p->nNodesAhead = 1000;
  p->nCallsRecycle = 100;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [This procedure sets default parameters.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Dch_ManSetDefaultParams( Dch_Pars_t * p )
{
    memset( p, 0, sizeof(Dch_Pars_t) );
    p->nWords         =     8;  // the number of simulation words
    p->nBTLimit       =  1000;  // conflict limit at a node
    p->nSatVarMax     =  5000;  // the max number of SAT variables
    p->fSynthesis     =     1;  // derives three snapshots
    p->fPolarFlip     =     1;  // uses polarity adjustment
    p->fSimulateTfo   =     1;  // simulate TFO
    p->fPower         =     0;  // power-aware rewriting
    p->fLightSynth    =     0;  // uses lighter version of synthesis
    p->fSkipRedSupp   =     0;  // skips choices with redundant structural support
    p->fVerbose       =     0;  // verbose stats
    p->nNodesAhead    =  1000;  // the lookahead in terms of nodes
    p->nCallsRecycle  =   100;  // calls to perform before recycling SAT solver
}